

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gme.cpp
# Opt level: O2

gme_err_t gme_open_file(char *path,Music_Emu **out,int sample_rate)

{
  int iVar1;
  undefined4 extraout_var;
  gme_type_t type;
  Music_Emu *this;
  char *pcVar2;
  size_t in_RCX;
  int __oflag;
  Remaining_Reader *in_00;
  long lStack_70;
  char header [4];
  Std_File_Reader in;
  Remaining_Reader rem;
  
  *out = (Music_Emu *)0x0;
  Std_File_Reader::Std_File_Reader(&in);
  iVar1 = Std_File_Reader::open(&in,path,__oflag);
  pcVar2 = (char *)CONCAT44(extraout_var,iVar1);
  if (pcVar2 != (char *)0x0) goto LAB_00551581;
  type = gme_identify_extension(path);
  if (type == (gme_type_t)0x0) {
    lStack_70 = 4;
    pcVar2 = (char *)Std_File_Reader::read(&in,(int)header,(void *)0x4,in_RCX);
    if (pcVar2 != (char *)0x0) goto LAB_00551581;
    pcVar2 = gme_identify_header(header);
    type = gme_identify_extension(pcVar2);
    if (type == (gme_type_t)0x0) {
      pcVar2 = "Wrong file type for this emulator";
      goto LAB_00551581;
    }
  }
  else {
    lStack_70 = 0;
  }
  this = gme_new_emu(type,sample_rate);
  if (this == (Music_Emu *)0x0) {
    pcVar2 = "Out of memory";
  }
  else {
    Remaining_Reader::Remaining_Reader(&rem,header,lStack_70,(Data_Reader *)&in);
    in_00 = &rem;
    pcVar2 = Gme_File::load(&this->super_Gme_File,&in_00->super_Data_Reader);
    Std_File_Reader::close(&in,(int)in_00);
    if (pcVar2 == (blargg_err_t)0x0) {
      *out = this;
    }
    else {
      (*(this->super_Gme_File)._vptr_Gme_File[1])(this);
    }
  }
LAB_00551581:
  Std_File_Reader::~Std_File_Reader(&in);
  return pcVar2;
}

Assistant:

BLARGG_EXPORT gme_err_t gme_open_file( const char* path, Music_Emu** out, int sample_rate )
{
	require( path && out );
	*out = 0;
	
	GME_FILE_READER in;
	RETURN_ERR( in.open( path ) );
	
	char header [4];
	int header_size = 0;
	
	gme_type_t file_type = gme_identify_extension( path );
	if ( !file_type )
	{
		header_size = sizeof header;
		RETURN_ERR( in.read( header, sizeof header ) );
		file_type = gme_identify_extension( gme_identify_header( header ) );
	}
	if ( !file_type )
		return gme_wrong_file_type;
	
	Music_Emu* emu = gme_new_emu( file_type, sample_rate );
	CHECK_ALLOC( emu );
	
	// optimization: avoids seeking/re-reading header
	Remaining_Reader rem( header, header_size, &in );
	gme_err_t err = emu->load( rem );
	in.close();
	
	if ( err )
		delete emu;
	else
		*out = emu;
	
	return err;
}